

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O0

void Wlc_IntInsert(Vec_Int_t *vProd,Vec_Int_t *vLevel,int Node,int Level)

{
  int iHere;
  int iVar1;
  int local_24;
  int i;
  int Level_local;
  int Node_local;
  Vec_Int_t *vLevel_local;
  Vec_Int_t *vProd_local;
  
  local_24 = Vec_IntSize(vLevel);
  do {
    iHere = local_24;
    local_24 = iHere + -1;
    if (local_24 < 0) break;
    iVar1 = Vec_IntEntry(vLevel,local_24);
  } while (iVar1 < Level);
  Vec_IntInsert(vProd,iHere,Node);
  Vec_IntInsert(vLevel,iHere,Level);
  return;
}

Assistant:

void Wlc_IntInsert( Vec_Int_t * vProd, Vec_Int_t * vLevel, int Node, int Level )
{
    int i;
    for ( i = Vec_IntSize(vLevel) - 1; i >= 0; i-- )
        if ( Vec_IntEntry(vLevel, i) >= Level )
            break;
    Vec_IntInsert( vProd,  i + 1, Node  );
    Vec_IntInsert( vLevel, i + 1, Level );
}